

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall icu_63::Normalizer2Impl::hasDecompBoundaryBefore(Normalizer2Impl *this,UChar32 c)

{
  UBool UVar1;
  uint16_t norm16;
  
  if (c < (int)(uint)(ushort)this->minLcccCP) {
    return '\x01';
  }
  if (((uint)c < 0x10000) && (UVar1 = singleLeadMightHaveNonZeroFCD16(this,c), UVar1 == '\0')) {
    return '\x01';
  }
  norm16 = getNorm16(this,c);
  UVar1 = norm16HasDecompBoundaryBefore(this,norm16);
  return UVar1;
}

Assistant:

UBool Normalizer2Impl::hasDecompBoundaryBefore(UChar32 c) const {
    return c < minLcccCP || (c <= 0xffff && !singleLeadMightHaveNonZeroFCD16(c)) ||
        norm16HasDecompBoundaryBefore(getNorm16(c));
}